

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

void Service_SetPublishingMode
               (UA_Server *server,UA_Session *session,UA_SetPublishingModeRequest *request,
               UA_SetPublishingModeResponse *response)

{
  size_t size;
  UA_UInt32 *pUVar1;
  UA_StatusCode UVar2;
  UA_StatusCode *pUVar3;
  UA_Subscription *pUVar4;
  size_t i;
  size_t sVar5;
  
  size = request->subscriptionIdsSize;
  if (size == 0) {
    UVar2 = 0x800f0000;
  }
  else {
    pUVar3 = (UA_StatusCode *)UA_Array_new(size,UA_TYPES + 0x12);
    response->results = pUVar3;
    if (pUVar3 != (UA_StatusCode *)0x0) {
      response->resultsSize = size;
      pUVar1 = request->subscriptionIds;
      for (sVar5 = 0; size != sVar5; sVar5 = sVar5 + 1) {
        pUVar4 = UA_Session_getSubscriptionByID(session,pUVar1[sVar5]);
        if (pUVar4 == (UA_Subscription *)0x0) {
          pUVar3[sVar5] = 0x80280000;
        }
        else if (pUVar4->publishingEnabled != request->publishingEnabled) {
          pUVar4->publishingEnabled = request->publishingEnabled;
          pUVar4->currentLifetimeCount = 0;
        }
      }
      return;
    }
    UVar2 = 0x80030000;
  }
  (response->responseHeader).serviceResult = UVar2;
  return;
}

Assistant:

void
Service_SetPublishingMode(UA_Server *server, UA_Session *session,
                          const UA_SetPublishingModeRequest *request,
                          UA_SetPublishingModeResponse *response) {
    UA_LOG_DEBUG_SESSION(server->config.logger, session,
                         "Processing SetPublishingModeRequest");
    if(request->subscriptionIdsSize <= 0) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADNOTHINGTODO;
        return;
    }

    size_t size = request->subscriptionIdsSize;
    response->results = UA_Array_new(size, &UA_TYPES[UA_TYPES_STATUSCODE]);
    if(!response->results) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADOUTOFMEMORY;
        return;
    }

    response->resultsSize = size;
    for(size_t i = 0; i < size; ++i) {
        UA_Subscription *sub =
            UA_Session_getSubscriptionByID(session, request->subscriptionIds[i]);
        if(!sub) {
            response->results[i] = UA_STATUSCODE_BADSUBSCRIPTIONIDINVALID;
            continue;
        }
        if(sub->publishingEnabled != request->publishingEnabled) {
            sub->publishingEnabled = request->publishingEnabled;
            sub->currentLifetimeCount = 0; /* Reset the subscription lifetime */
        }
    }
}